

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O2

void __thiscall
spdlog::async_logger::_set_formatter(async_logger *this,formatter_ptr *msg_formatter)

{
  formatter_ptr *this_00;
  async_log_helper *this_01;
  __shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  this_00 = &(this->super_logger)._formatter;
  std::__shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>,
             &msg_formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>);
  this_01 = (this->_async_log_helper)._M_t.
            super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
            ._M_t.
            super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
            .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl;
  std::__shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&this_00->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2> *)this_01,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

inline void spdlog::async_logger::_set_formatter(spdlog::formatter_ptr msg_formatter)
{
    _formatter = msg_formatter;
    _async_log_helper->set_formatter(_formatter);
}